

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestCheckMacros.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_3cf1::TestCheckArrayCloseFailsOnException::~TestCheckArrayCloseFailsOnException
          (TestCheckArrayCloseFailsOnException *this)

{
  TestCheckArrayCloseFailsOnException *this_local;
  
  ~TestCheckArrayCloseFailsOnException(this);
  operator_delete(this,0x38);
  return;
}

Assistant:

TEST(CheckArrayCloseFailsOnException)
{
    bool failure = false;
    {
        RecordingReporter reporter;
        UnitTest::TestResults testResults(&reporter);
		ScopedCurrentTest scopedResults(testResults);

		const float data[4] = { 0, 1, 2, 3 };
        ThrowingObject obj;
        CHECK_ARRAY_CLOSE (data, obj, 3, 0.01f);

		failure = (testResults.GetFailureCount() > 0);
    }

    CHECK(failure);
}